

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_tEXt(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  char *key;
  char *str;
  long lVar1;
  uint uVar2;
  uint uVar4;
  ulong uVar3;
  ulong __size;
  
  if (chunkLength == 0) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar2 = (uint)uVar3;
      if (data[uVar3] == '\0') break;
      uVar2 = uVar2 + 1;
      uVar3 = (ulong)uVar2;
    } while (uVar3 < chunkLength);
  }
  if (uVar2 - 0x50 < 0xffffffb1) {
    uVar2 = 0x59;
    key = (char *)0x0;
    str = (char *)0x0;
  }
  else {
    uVar4 = uVar2 + 1;
    __size = (ulong)uVar4;
    key = (char *)malloc(__size);
    if (key == (char *)0x0) {
      key = (char *)0x0;
    }
    else {
      key[uVar3] = '\0';
      if (uVar2 != 0) {
        memcpy(key,data,(ulong)uVar2);
      }
      uVar2 = (int)chunkLength - uVar4;
      if (chunkLength < __size) {
        uVar2 = 0;
      }
      str = (char *)malloc((ulong)(uVar2 + 1));
      if (str != (char *)0x0) {
        str[uVar2] = '\0';
        if (__size < chunkLength) {
          lVar1 = 0;
          do {
            str[lVar1] = data[(int)lVar1 + uVar4];
            lVar1 = lVar1 + 1;
          } while (uVar2 != (uint)lVar1);
        }
        uVar2 = lodepng_add_text(info,key,str);
        goto LAB_00113d42;
      }
    }
    str = (char *)0x0;
    uVar2 = 0x53;
  }
LAB_00113d42:
  free(key);
  free(str);
  return uVar2;
}

Assistant:

static unsigned readChunk_tEXt(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  char *key = 0, *str = 0;
  unsigned i;

  while(!error) /*not really a while loop, only used to break on error*/ {
    unsigned length, string2_begin;

    length = 0;
    while(length < chunkLength && data[length] != 0) ++length;
    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    string2_begin = length + 1; /*skip keyword null terminator*/

    length = (unsigned)(chunkLength < string2_begin ? 0 : chunkLength - string2_begin);
    str = (char*)lodepng_malloc(length + 1);
    if(!str) CERROR_BREAK(error, 83); /*alloc fail*/

    str[length] = 0;
    for(i = 0; i != length; ++i) str[i] = (char)data[string2_begin + i];

    error = lodepng_add_text(info, key, str);

    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}